

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O0

QSize __thiscall QTabWidget::sizeHint(QTabWidget *this)

{
  bool bVar1;
  int iVar2;
  QTabWidgetPrivate *lc_00;
  QStyle *pQVar3;
  QSize QVar4;
  QRect *in_RDI;
  undefined8 in_R9;
  long in_FS_OFFSET;
  QWidget *w;
  int i;
  QTabWidget *that;
  QTabWidgetPrivate *d;
  QSize sz;
  QSize t;
  QSize s;
  QSize rc;
  QSize lc;
  QStyleOptionTabWidgetFrame opt;
  QWidget *in_stack_fffffffffffffe98;
  QTabWidgetPrivate *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  QWidget *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int iVar5;
  int iVar6;
  QRect *in_stack_fffffffffffffec8;
  QRect *pQVar7;
  undefined1 horizontal;
  QSize local_114;
  undefined1 local_10c [16];
  QSize local_fc;
  QSize local_f4;
  QSize local_e4;
  undefined8 local_dc;
  QSize local_d4;
  undefined8 local_cc;
  QSize local_c4;
  QSize local_bc;
  undefined1 *local_b4;
  undefined1 *local_ac;
  undefined4 local_a4;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 local_90 [8];
  undefined4 local_88;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = in_RDI;
  lc_00 = d_func((QTabWidget *)0x6e70b0);
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               (int)in_stack_fffffffffffffe98);
  local_a0 = &DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               (int)in_stack_fffffffffffffe98);
  memset(local_90,0xaa,0x88);
  QStyleOptionTabWidgetFrame::QStyleOptionTabWidgetFrame((QStyleOptionTabWidgetFrame *)0x6e7119);
  (**(code **)(*(long *)in_RDI + 0x1b0))(in_RDI,local_90);
  QFlags<QStyle::StateFlag>::QFlags
            ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffea0,
             (StateFlag)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  local_88 = local_a4;
  if ((lc_00->leftCornerWidget != (QWidget *)0x0) &&
     (bVar1 = QWidget::isVisible((QWidget *)0x6e716c), bVar1)) {
    local_ac = (undefined1 *)(**(code **)(*(long *)lc_00->leftCornerWidget + 0x70))();
    local_98 = local_ac;
  }
  if ((lc_00->rightCornerWidget != (QWidget *)0x0) &&
     (bVar1 = QWidget::isVisible((QWidget *)0x6e71bc), bVar1)) {
    local_b4 = (undefined1 *)(**(code **)(*(long *)lc_00->rightCornerWidget + 0x70))();
    local_a0 = local_b4;
  }
  if ((lc_00->dirty & 1U) == 0) {
    in_stack_fffffffffffffec8 = in_RDI;
    setUpLayout((QTabWidget *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                SUB81((ulong)in_stack_fffffffffffffea0 >> 0x38,0));
  }
  local_bc = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)in_stack_fffffffffffffea0);
  iVar5 = 0;
  while( true ) {
    iVar6 = iVar5;
    iVar2 = QStackedWidget::count((QStackedWidget *)0x6e7250);
    horizontal = (undefined1)((ulong)pQVar7 >> 0x38);
    if (iVar2 <= iVar5) break;
    in_stack_fffffffffffffeb8 =
         QStackedWidget::widget
                   ((QStackedWidget *)in_stack_fffffffffffffea0,
                    (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    if ((in_stack_fffffffffffffeb8 != (QWidget *)0x0) &&
       (bVar1 = QTabBar::isTabVisible
                          ((QTabBar *)CONCAT44(iVar5,in_stack_fffffffffffffea8),
                           (int)((ulong)in_stack_fffffffffffffea0 >> 0x20)), bVar1)) {
      local_cc = (**(code **)(*(long *)in_stack_fffffffffffffeb8 + 0x70))();
      local_c4 = QSize::expandedTo((QSize *)CONCAT44(iVar5,in_stack_fffffffffffffea8),
                                   (QSize *)in_stack_fffffffffffffea0);
      local_bc = local_c4;
    }
    iVar5 = iVar6 + 1;
  }
  local_d4 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)in_stack_fffffffffffffea0);
  bVar1 = QTabWidgetPrivate::isAutoHidden(in_stack_fffffffffffffea0);
  if (!bVar1) {
    local_dc = (**(code **)(*(long *)&lc_00->tabs->super_QWidget + 0x70))();
    local_d4 = (QSize)local_dc;
    bVar1 = usesScrollButtons((QTabWidget *)0x6e7351);
    if (bVar1) {
      QSize::QSize((QSize *)in_stack_fffffffffffffea0,
                   (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),(int)in_stack_fffffffffffffe98);
      local_e4 = QSize::boundedTo((QSize *)CONCAT44(iVar5,in_stack_fffffffffffffea8),
                                  (QSize *)in_stack_fffffffffffffea0);
      local_d4 = local_e4;
    }
    else {
      QGuiApplication::primaryScreen();
      local_10c = QScreen::virtualGeometry();
      local_fc = QRect::size(in_RDI);
      local_f4 = QSize::boundedTo((QSize *)CONCAT44(iVar5,in_stack_fffffffffffffea8),
                                  (QSize *)in_stack_fffffffffffffea0);
      local_d4 = local_f4;
    }
  }
  local_114 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_114 = basicSize((bool)horizontal,(QSize *)lc_00,(QSize *)in_stack_fffffffffffffec8,
                        (QSize *)CONCAT44(iVar6,in_stack_fffffffffffffec0),
                        (QSize *)in_stack_fffffffffffffeb8);
  pQVar3 = QWidget::style(in_stack_fffffffffffffe98);
  QVar4 = (QSize)(**(code **)(*(long *)pQVar3 + 0xe8))
                           (pQVar3,0x11,local_90,&local_114,in_RDI,in_R9,local_90);
  QStyleOptionTabWidgetFrame::~QStyleOptionTabWidgetFrame((QStyleOptionTabWidgetFrame *)0x6e7489);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QSize QTabWidget::sizeHint() const
{
    Q_D(const QTabWidget);
    QSize lc(0, 0), rc(0, 0);
    QStyleOptionTabWidgetFrame opt;
    initStyleOption(&opt);
    opt.state = QStyle::State_None;

    if (d->leftCornerWidget && d->leftCornerWidget->isVisible())
        lc = d->leftCornerWidget->sizeHint();
    if (d->rightCornerWidget  && d->rightCornerWidget->isVisible())
        rc = d->rightCornerWidget->sizeHint();
    if (!d->dirty) {
        QTabWidget *that = const_cast<QTabWidget*>(this);
        that->setUpLayout(true);
    }
    QSize s;
    for (int i=0; i< d->stack->count(); ++i) {
        if (const QWidget* w = d->stack->widget(i)) {
            if (d->tabs->isTabVisible(i))
                s = s.expandedTo(w->sizeHint());
        }
    }
    QSize t;
    if (!d->isAutoHidden()) {
        t = d->tabs->sizeHint();
        if (usesScrollButtons())
            t = t.boundedTo(QSize(200,200));
        else
            t = t.boundedTo(QGuiApplication::primaryScreen()->virtualGeometry().size());
    }

    QSize sz = basicSize(d->pos == North || d->pos == South, lc, rc, s, t);

    return style()->sizeFromContents(QStyle::CT_TabWidget, &opt, sz, this);
}